

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

string * anon_unknown.dwarf_52dd::xmlEscape(string *__return_storage_ptr__,string *source)

{
  char cVar1;
  ulong uVar2;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  while (uVar2 = std::__cxx11::string::find_first_of((char *)__return_storage_ptr__,0x10f050),
        uVar2 != 0xffffffffffffffff) {
    cVar1 = (__return_storage_ptr__->_M_dataplus)._M_p[uVar2];
    if ((cVar1 == '>') || (cVar1 == '<')) {
      std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar2,(char *)0x1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string xmlEscape(std::string const& source)
    {
        string result = source;
        size_t pos = result.find_first_of("<>");
        while (pos != string::npos)
        {
            if (result[pos] == '<')
                result.replace(pos, 1, "&lt;");
            else if (result[pos] == '>')
                result.replace(pos, 1, "&gt;");
            pos = result.find_first_of("<>");
        }

        return result;
    }